

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedTimeSamples<tinyusdz::Extent>::add_sample
          (TypedTimeSamples<tinyusdz::Extent> *this,double t,Extent *v)

{
  undefined1 local_48 [8];
  Sample s;
  Extent *v_local;
  double t_local;
  TypedTimeSamples<tinyusdz::Extent> *this_local;
  
  s._32_8_ = v;
  Sample::Sample((Sample *)local_48);
  s.t = *(double *)s._32_8_;
  s.value.lower._M_elems._0_8_ = *(undefined8 *)(s._32_8_ + 8);
  s.value._8_8_ = *(undefined8 *)(s._32_8_ + 0x10);
  local_48 = (undefined1  [8])t;
  ::std::
  vector<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>>
              *)this,(Sample *)local_48);
  this->_dirty = true;
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }